

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.h
# Opt level: O3

int RecvDataMDM(MDM *pMDM,uint8 *buf,int buflen,int *pReceivedBytes)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (pMDM->InternalBufferSize < buflen) {
    pcVar4 = "Too many data to receive at once. ";
  }
  else {
    iVar1 = (pMDM->RS232Port).DevType;
    pcVar4 = "Error receiving data with a MDM. ";
    if (iVar1 - 1U < 4) {
      sVar2 = recv((pMDM->RS232Port).s,buf,(long)buflen,0);
      iVar1 = (int)sVar2;
      *pReceivedBytes = iVar1;
    }
    else {
      if (iVar1 != 0) goto LAB_001c540d;
      sVar2 = read(*(int *)&(pMDM->RS232Port).hDev,buf,(ulong)(uint)buflen);
      iVar1 = (int)sVar2;
      *pReceivedBytes = iVar1;
    }
    if (0 < iVar1) {
      return 0;
    }
  }
LAB_001c540d:
  pcVar3 = strtime_m();
  printf("RecvDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar3,pcVar4,(ulong)pMDM & 0xffffffff);
  return 1;
}

Assistant:

inline int RecvDataMDM(MDM* pMDM, uint8* buf, int buflen, int* pReceivedBytes)
{
#ifdef _DEBUG_MESSAGES_MDM
	int i = 0;
#endif // _DEBUG_MESSAGES_MDM

	if (buflen > pMDM->InternalBufferSize)
	{
		printf("RecvDataMDM error (%s) : %s"
			"(pMDM=%#x)\n", 
			strtime_m(), 
			"Too many data to receive at once. ", 
			(unsigned int)(intptr_t)pMDM);
		return EXIT_FAILURE;
	}

	if (ReadRS232Port(&pMDM->RS232Port, buf, buflen, pReceivedBytes) != EXIT_SUCCESS)
	{
		printf("RecvDataMDM error (%s) : %s"
			"(pMDM=%#x)\n", 
			strtime_m(), 
			"Error receiving data with a MDM. ", 
			(unsigned int)(intptr_t)pMDM);
		return EXIT_FAILURE;
	}

#ifdef _DEBUG_MESSAGES_MDM
	for (i = 0; i < *pReceivedBytes; i++)
	{
		printf("%.2x ", (int)buf[i]);
	}
	printf("\n");
#endif // _DEBUG_MESSAGES_MDM

#ifdef ENABLE_DEFAULT_SAVE_RAW_DATA_MDM
	if ((pMDM->bSaveRawData)&&(pMDM->pfSaveFile)) 
	{
		fwrite(buf, *pReceivedBytes, 1, pMDM->pfSaveFile);
		fflush(pMDM->pfSaveFile);
	}
#endif // ENABLE_DEFAULT_SAVE_RAW_DATA_MDM

	return EXIT_SUCCESS;
}